

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O3

void wasm_val_delete(wasm_val_t *val)

{
  wasm_ref_t *pwVar1;
  
  if (val != (wasm_val_t *)0x0) {
    if ((char)val->kind < '\0') {
      pwVar1 = (val->of).ref;
      if ((pwVar1 != (wasm_ref_t *)0x0) && ((pwVar1->I).obj_ != (Object *)0x0)) {
        wabt::interp::Store::DeleteRoot((pwVar1->I).store_,(pwVar1->I).root_index_);
      }
      operator_delete(pwVar1,0x18);
      (val->of).i64 = 0;
    }
    return;
  }
  __assert_fail("val",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp-wasm-c-api.cc"
                ,0x23a,"void wasm_val_delete(wasm_val_t *)");
}

Assistant:

void wasm_val_delete(own wasm_val_t* val) {
  assert(val);
  if (wasm_valkind_is_ref(val->kind)) {
    delete val->of.ref;
    val->of.ref = nullptr;
  }
}